

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O3

int __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::getQuadrant(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
              *this,Box<float> *nodeBox,Box<float> *valueBox)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = (this->mBox).width * 0.5 + (this->mBox).left;
  fVar2 = (this->mBox).height * 0.5 + (this->mBox).top;
  if (fVar3 <= nodeBox->width + nodeBox->left) {
    uVar1 = 0xffffffff;
    if (fVar3 <= nodeBox->left) {
      uVar1 = 1;
      if (fVar2 <= nodeBox->height + nodeBox->top) {
        uVar1 = -(uint)(nodeBox->top < fVar2) | 3;
      }
    }
  }
  else {
    uVar1 = 0;
    if (fVar2 <= nodeBox->height + nodeBox->top) {
      uVar1 = -(uint)(nodeBox->top < fVar2) | 2;
    }
  }
  return uVar1;
}

Assistant:

int getQuadrant(const Box<Float>& nodeBox, const Box<Float>& valueBox) const
    {
        auto center = nodeBox.getCenter();
        // West
        if (valueBox.getRight() < center.x)
        {
            // North West
            if (valueBox.getBottom() < center.y)
                return 0;
            // South West
            else if (valueBox.top >= center.y)
                return 2;
            // Not contained in any quadrant
            else
                return -1;
        }
        // East
        else if (valueBox.left >= center.x)
        {
            // North East
            if (valueBox.getBottom() < center.y)
                return 1;
            // South East
            else if (valueBox.top >= center.y)
                return 3;
            // Not contained in any quadrant
            else
                return -1;
        }
        // Not contained in any quadrant
        else
            return -1;
    }